

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaemonClient.cpp
# Opt level: O2

int64_t __thiscall xmrig::DaemonClient::getBlockTemplate(DaemonClient *this)

{
  long lVar1;
  int __flags;
  Value params;
  StringRefType local_a0;
  String local_90;
  StringRefType local_80;
  Document doc;
  
  __flags = 0;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(&doc,kObjectType,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  params.data_.n = (Number)0x0;
  params.data_.s.str = (Ch *)0x3000000000000;
  local_a0.s = "wallet_address";
  local_a0.length = 0xe;
  String::toJSON(&local_90);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(&params,&local_a0,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_90,doc.allocator_);
  local_80.s = "reserve_size";
  local_80.length = 0xc;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>(&params,&local_80,8,doc.allocator_);
  JsonRequest::create(&doc,BaseClient::m_sequence,"getblocktemplate",&params);
  send(this,3,"/json_rpc",(size_t)&doc,__flags);
  lVar1 = BaseClient::m_sequence;
  BaseClient::m_sequence = BaseClient::m_sequence + 1;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument(&doc);
  return lVar1;
}

Assistant:

int64_t xmrig::DaemonClient::getBlockTemplate()
{
    using namespace rapidjson;
    Document doc(kObjectType);
    auto &allocator = doc.GetAllocator();

    Value params(kObjectType);
    params.AddMember("wallet_address", m_pool.user().toJSON(), allocator);
    params.AddMember("reserve_size",   8,                      allocator);

    JsonRequest::create(doc, m_sequence, "getblocktemplate", params);

    send(HTTP_POST, kJsonRPC, doc);

    return m_sequence++;
}